

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error open_face_from_buffer
                   (FT_Library library,FT_Byte *base,FT_ULong size,FT_Long face_index,
                   char *driver_name,FT_Face *aface)

{
  FT_Memory memory;
  FT_UInt FVar1;
  FT_Error FVar2;
  int iVar3;
  int local_74;
  FT_Open_Args local_70;
  
  memory = library->memory;
  if (driver_name == (char *)0x0) {
    FVar1 = 2;
  }
  else {
    local_70.driver = FT_Get_Module(library,driver_name);
    if (local_70.driver == (FT_Module)0x0) {
      iVar3 = 0xb;
      if (base == (FT_Byte *)0x0) {
        return 0xb;
      }
      goto LAB_001df76f;
    }
    FVar1 = 10;
  }
  if (base == (FT_Byte *)0x0) {
    return 6;
  }
  local_70.stream = (FT_Stream)ft_mem_alloc(memory,0x50,&local_74);
  iVar3 = local_74;
  if (local_74 == 0) {
    (local_70.stream)->base = base;
    (local_70.stream)->size = size;
    (local_70.stream)->pos = 0;
    (local_70.stream)->cursor = (uchar *)0x0;
    (local_70.stream)->read = (FT_Stream_IoFunc)0x0;
    ((local_70.stream)->descriptor).pointer = memory;
    (local_70.stream)->close = memory_stream_close;
    local_70.flags = FVar1;
    FVar2 = ft_open_face_internal(library,&local_70,face_index,aface,'\0');
    return FVar2;
  }
LAB_001df76f:
  (*memory->free)(memory,base);
  return iVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  open_face_from_buffer( FT_Library   library,
                         FT_Byte*     base,
                         FT_ULong     size,
                         FT_Long      face_index,
                         const char*  driver_name,
                         FT_Face     *aface )
  {
    FT_Open_Args  args;
    FT_Error      error;
    FT_Memory     memory = library->memory;


    args.flags = 0;

    if ( driver_name )
    {
      args.driver = FT_Get_Module( library, driver_name );
      if ( !args.driver )
      {
        FT_FREE( base );
        return FT_THROW( Missing_Module );
      }

      args.flags = args.flags | FT_OPEN_DRIVER;
    }

    /* `memory_stream_close` also frees the stream object. */
    error = new_memory_stream( library,
                               base,
                               size,
                               memory_stream_close,
                               &args.stream );
    if ( error )
    {
      FT_FREE( base );
      return error;
    }

    args.flags |= FT_OPEN_STREAM;

#ifdef FT_MACINTOSH
    /* At this point, the face index has served its purpose;  */
    /* whoever calls this function has already used it to     */
    /* locate the correct font data.  We should not propagate */
    /* this index to FT_Open_Face() (unless it is negative).  */

    if ( face_index > 0 )
      face_index &= 0x7FFF0000L; /* retain GX data */
#endif

    return ft_open_face_internal( library, &args, face_index, aface, 0 );
  }